

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O0

native_object_property * __thiscall mjs::native_object::find(native_object *this,wstring_view *v)

{
  const_reference pvVar1;
  uint local_4c;
  char local_48 [4];
  uint32_t i;
  char name [32];
  size_type len;
  wstring_view *v_local;
  native_object *this_local;
  
  name._24_8_ = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(v);
  if ((ulong)name._24_8_ < 0x20) {
    for (local_4c = 0; (ulong)local_4c < (ulong)name._24_8_; local_4c = local_4c + 1) {
      pvVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         (v,(ulong)local_4c);
      if ((*pvVar1 < 0x20) ||
         (pvVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                             (v,(ulong)local_4c), 0x7e < *pvVar1)) {
        return (native_object_property *)0x0;
      }
      pvVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::operator[]
                         (v,(ulong)local_4c);
      local_48[local_4c] = (char)*pvVar1;
    }
    local_48[name._24_8_] = '\0';
    this_local = (native_object *)find(this,local_48);
  }
  else {
    this_local = (native_object *)0x0;
  }
  return (native_object_property *)this_local;
}

Assistant:

native_object::native_object_property* native_object::find(const std::wstring_view& v) const {
    const auto len = v.length();
    if (len >= sizeof(native_object_property::name)) {
        return nullptr;
    }
    char name[sizeof(native_object_property::name)];
    for (uint32_t i = 0; i < len; ++i) {
        if (v[i] < 32 || v[i] >= 127) {
            return nullptr;
        }
        name[i] = static_cast<char>(v[i]);
    }
    name[len] = '\0';
    return find(name);
}